

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_OperatorPhase1(opm_t *chip)

{
  uint16_t local_16;
  int16_t mod;
  uint32_t slot;
  opm_t *chip_local;
  
  local_16 = chip->op_mod[2];
  chip->op_phase_in = (uint16_t)(chip->pg_phase[chip->cycles] >> 10);
  if ((chip->op_fbshift & 8) != 0) {
    if (chip->op_fb[1] == 0) {
      local_16 = 0;
    }
    else {
      local_16 = (uint16_t)((int)(short)local_16 >> (9U - (char)chip->op_fb[1] & 0x1f));
    }
  }
  chip->op_mod_in = local_16;
  return;
}

Assistant:

static void OPM_OperatorPhase1(opm_t *chip)
{
    uint32_t slot = chip->cycles;
    int16_t mod = chip->op_mod[2];
    chip->op_phase_in = chip->pg_phase[slot] >> 10;
    if (chip->op_fbshift & 8)
    {
        if (chip->op_fb[1] == 0)
        {
            mod = 0;
        }
        else
        {
            mod = mod >> (9 - chip->op_fb[1]);
        }
    }
    chip->op_mod_in = mod;
}